

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O0

void __thiscall
iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  unsigned_long *val2;
  type **in_stack_fffffffffffff0b8;
  AssertionHelper local_e78;
  Fixed local_e48;
  iu_uint_max_t local_cc0;
  char local_cb4 [4];
  undefined1 local_cb0 [8];
  AssertionResult iutest_ar_6;
  Fixed local_c58;
  iu_uint_max_t local_ad0;
  char local_ac4 [4];
  undefined1 local_ac0 [8];
  AssertionResult iutest_ar_5;
  Fixed local_a68;
  undefined1 local_8e0 [8];
  AssertionResult iutest_ar_4;
  AssertionHelper local_898;
  Fixed local_868;
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult iutest_ar_3;
  AssertionHelper local_690;
  Fixed local_660;
  bool local_4d1;
  undefined1 local_4d0 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_488;
  Fixed local_458;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult iutest_ar_1;
  string local_298;
  AssertionHelper local_278;
  Fixed local_248;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult iutest_ar;
  undefined1 local_80 [8];
  FilePath filename;
  StdioFile file;
  char rbuf [32];
  char wbuf [17];
  iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test *this_local;
  
  builtin_strncpy(rbuf + 0x18,"test1234",8);
  rbuf[8] = '\0';
  rbuf[9] = '\0';
  rbuf[10] = '\0';
  rbuf[0xb] = '\0';
  rbuf[0xc] = '\0';
  rbuf[0xd] = '\0';
  rbuf[0xe] = '\0';
  rbuf[0xf] = '\0';
  rbuf[0x10] = '\0';
  rbuf[0x11] = '\0';
  rbuf[0x12] = '\0';
  rbuf[0x13] = '\0';
  rbuf[0x14] = '\0';
  rbuf[0x15] = '\0';
  rbuf[0x16] = '\0';
  rbuf[0x17] = '\0';
  file.m_fp = (FILE *)0x0;
  rbuf[0] = '\0';
  rbuf[1] = '\0';
  rbuf[2] = '\0';
  rbuf[3] = '\0';
  rbuf[4] = '\0';
  rbuf[5] = '\0';
  rbuf[6] = '\0';
  rbuf[7] = '\0';
  iutest::StdioFile::StdioFile((StdioFile *)((long)&filename.m_path.field_2 + 8));
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_80,"./testdata/unit_file_tests.tmp");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::string_abi_cxx11_((iuFilePath *)local_80);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_b9 = iutest::IFile::Open((IFile *)((long)&filename.m_path.field_2 + 8),pcVar2,2);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_b8,&local_b9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    memset(&local_248,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_248);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_298,(internal *)local_b8,
               (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenWrite)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x35,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_278,&local_248);
    iutest::AssertionHelper::~AssertionHelper(&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    iutest::AssertionHelper::Fixed::~Fixed(&local_248);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_2c9 = iutest::StdioFile::Write
                          ((StdioFile *)((long)&filename.m_path.field_2 + 8),rbuf + 0x18,4,4);
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_2c8,&local_2c9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
    if (!bVar1) {
      memset(&local_458,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_458);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_2.m_result,(internal *)local_2c8,
                 (AssertionResult *)"file.Write(wbuf, 4, 4)","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_488,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                 ,0x36,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_488,&local_458);
      iutest::AssertionHelper::~AssertionHelper(&local_488);
      std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_458);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      iutest::detail::iuFilePath::string_abi_cxx11_((iuFilePath *)local_80);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      local_4d1 = iutest::IFile::Open((IFile *)((long)&filename.m_path.field_2 + 8),pcVar2,1);
      iutest::AssertionResult::Is<bool>((AssertionResult *)local_4d0,&local_4d1);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
      if (!bVar1) {
        memset(&local_660,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_660);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  ((string *)&iutest_ar_3.m_result,(internal *)local_4d0,
                   (AssertionResult *)
                   "file.Open(filename.string().c_str(), iutest::IFile::OpenRead)","false","true",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iutest::AssertionHelper::AssertionHelper
                  (&local_690,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                   ,0x37,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=(&local_690,&local_660);
        iutest::AssertionHelper::~AssertionHelper(&local_690);
        std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_660);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
      if (iutest_ar_1._36_4_ == 0) {
        iutest::detail::AlwaysZero();
        local_6d9 = iutest::StdioFile::Read
                              ((StdioFile *)((long)&filename.m_path.field_2 + 8),&file.m_fp,4,4);
        iutest::AssertionResult::Is<bool>((AssertionResult *)local_6d8,&local_6d9);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
        if (!bVar1) {
          memset(&local_868,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_868);
          iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                    ((string *)&iutest_ar_4.m_result,(internal *)local_6d8,
                     (AssertionResult *)"file.Read(rbuf, 4, 4)","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          iutest::AssertionHelper::AssertionHelper
                    (&local_898,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                     ,0x38,pcVar2,kFatalFailure);
          iutest::AssertionHelper::operator=(&local_898,&local_868);
          iutest::AssertionHelper::~AssertionHelper(&local_898);
          std::__cxx11::string::~string((string *)&iutest_ar_4.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_868);
        }
        iutest_ar_1._37_3_ = 0;
        iutest_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
        if (iutest_ar_1._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          val2 = &iutest_type_traits::enabler_t<void>::value;
          iutest::internal::CmpHelperSTREQ<char*,char*>
                    ((AssertionResult *)local_8e0,(internal *)"wbuf","rbuf",rbuf + 0x18,
                     (char *)&file.m_fp,(char *)&iutest_type_traits::enabler_t<void>::value,
                     in_stack_fffffffffffff0b8);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e0);
          if (!bVar1) {
            memset(&local_a68,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_a68);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_8e0);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_5.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                       ,0x39,pcVar2,kNonFatalFailure);
            iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_a68);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_a68);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_8e0);
          iutest::detail::AlwaysZero();
          local_ac4[0] = '\0';
          local_ac4[1] = '\0';
          local_ac4[2] = '\0';
          local_ac4[3] = '\0';
          local_ad0 = iutest::StdioFile::GetSize((StdioFile *)((long)&filename.m_path.field_2 + 8));
          iutest::internal::CmpHelperLT<unsigned_int,unsigned_long>
                    ((AssertionResult *)local_ac0,(internal *)"0u","file.GetSize()",local_ac4,
                     (uint *)&local_ad0,val2);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
          if (!bVar1) {
            memset(&local_c58,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_c58);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_ac0);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_ar_6.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                       ,0x3a,pcVar2,kNonFatalFailure);
            iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_6.m_result,&local_c58);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_6.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_c58);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
          iutest::detail::AlwaysZero();
          local_cb4[0] = '\0';
          local_cb4[1] = '\0';
          local_cb4[2] = '\0';
          local_cb4[3] = '\0';
          local_cc0 = iutest::StdioFile::GetSize((FILE *)0x0);
          iutest::internal::backward::EqHelper<true>::Compare<unsigned_int,unsigned_long>
                    ((AssertionResult *)local_cb0,(EqHelper<true> *)"0u",
                     "::iutest::StdioFile::GetSize(__null)",local_cb4,(uint *)&local_cc0,
                     &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffff0b8);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cb0);
          if (!bVar1) {
            memset(&local_e48,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_e48);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_cb0);
            iutest::AssertionHelper::AssertionHelper
                      (&local_e78,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
                       ,0x3b,pcVar2,kNonFatalFailure);
            iutest::AssertionHelper::operator=(&local_e78,&local_e48);
            iutest::AssertionHelper::~AssertionHelper(&local_e78);
            iutest::AssertionHelper::Fixed::~Fixed(&local_e48);
          }
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_cb0);
          iutest_ar_1._36_4_ = 0;
        }
      }
    }
  }
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_80);
  iutest::StdioFile::~StdioFile((StdioFile *)((long)&filename.m_path.field_2 + 8));
  return;
}

Assistant:

IUTEST(StdFileUnitTest, ReadWrite)
{
    char wbuf[] = "test1234abcdWXYZ";
    char rbuf[32] = { 0 };
    ::iutest::StdioFile file;
    ::iutest::internal::FilePath filename("./testdata/unit_file_tests.tmp");
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenWrite) );
    IUTEST_ASSERT_TRUE( file.Write(wbuf, 4, 4));
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenRead) );
    IUTEST_ASSERT_TRUE( file.Read(rbuf, 4, 4));
    IUTEST_EXPECT_STREQ(wbuf, rbuf);
    IUTEST_EXPECT_LT(0u, file.GetSize());
    IUTEST_EXPECT_EQ(0u, ::iutest::StdioFile::GetSize(NULL));
}